

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_array.cpp
# Opt level: O2

void __thiscall
SparseArray_IteratorInitializationTooFewValues_Test<unsigned_long>::
~SparseArray_IteratorInitializationTooFewValues_Test
          (SparseArray_IteratorInitializationTooFewValues_Test<unsigned_long> *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST (SparseArray, IteratorInitializationTooFewValues) {
    std::vector<std::size_t> i1{0, 2, 4};
    std::vector<int> v1{1};

    auto arrp = sparse_array<int, TypeParam>::make_unique (std::begin (i1), std::end (i1),
                                                           std::begin (v1), std::end (v1));
    auto & arr = *arrp;

    EXPECT_EQ (arr[0], 1);
    EXPECT_FALSE (arr.has_index (1));
    EXPECT_EQ (arr[2], 0);
    EXPECT_FALSE (arr.has_index (3));
    EXPECT_EQ (arr[4], 0);
}